

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_callback_helper.h
# Opt level: O0

bool __thiscall
miniros::
ServiceCallbackHelperT<miniros::ServiceSpec<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>_>
::call(ServiceCallbackHelperT<miniros::ServiceSpec<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>_>
       *this,ServiceCallbackHelperCallParams *params)

{
  byte bVar1;
  uint uVar2;
  CallbackType *in_RSI;
  SetBoolRequest_<std::allocator<void>_> *in_RDI;
  bool ok;
  ServiceSpecCallParams<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
  call_params;
  ResponsePtr res;
  RequestPtr req;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  __shared_ptr_access<std_srvs::SetBoolRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff30;
  SerializedMessage *this_00;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  SerializedMessage *in_stack_ffffffffffffff50;
  SetBoolResponse_<std::allocator<void>_> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbf;
  
  std::function<std::shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_>_()>::operator()
            ((function<std::shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_>_()> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::function<std::shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_>_()>::operator()
            ((function<std::shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_>_()> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::
  __shared_ptr_access<std_srvs::SetBoolRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*(in_stack_ffffffffffffff30);
  serialization::deserializeMessage<std_srvs::SetBoolRequest_<std::allocator<void>>>
            (in_stack_ffffffffffffff50,in_RDI);
  this_00 = (SerializedMessage *)&stack0xffffffffffffff90;
  ServiceSpecCallParams<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
  ::ServiceSpecCallParams
            ((ServiceSpecCallParams<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
              *)this_00);
  std::shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_>::operator=
            ((shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_> *)this_00,
             (shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_>::operator=
            ((shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_> *)this_00,
             (shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)this_00,
              (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = ServiceSpec<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
          ::call(in_RSI,(ServiceSpecCallParams<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  uVar2 = (uint)bVar1;
  std::
  __shared_ptr_access<std_srvs::SetBoolResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std_srvs::SetBoolResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)this_00);
  serialization::serializeServiceResponse<std_srvs::SetBoolResponse_<std::allocator<void>>>
            ((bool)in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0);
  SerializedMessage::operator=
            (this_00,(SerializedMessage *)CONCAT44(uVar2,in_stack_ffffffffffffff28));
  SerializedMessage::~SerializedMessage(this_00);
  ServiceSpecCallParams<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
  ::~ServiceSpecCallParams
            ((ServiceSpecCallParams<std_srvs::SetBoolRequest_<std::allocator<void>_>,_std_srvs::SetBoolResponse_<std::allocator<void>_>_>
              *)this_00);
  std::shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_>::~shared_ptr
            ((shared_ptr<std_srvs::SetBoolResponse_<std::allocator<void>_>_> *)0x1c6ed0);
  std::shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_>::~shared_ptr
            ((shared_ptr<std_srvs::SetBoolRequest_<std::allocator<void>_>_> *)0x1c6edd);
  return (bool)(bVar1 & 1);
}

Assistant:

virtual bool call(ServiceCallbackHelperCallParams& params)
  {
    namespace ser = serialization;
    RequestPtr req(create_req_());
    ResponsePtr res(create_res_());

    ser::deserializeMessage(params.request, *req);

    ServiceSpecCallParams<RequestType, ResponseType> call_params;
    call_params.request = req;
    call_params.response = res;
    call_params.connection_header = params.connection_header;
    bool ok = Spec::call(callback_, call_params);
    params.response = ser::serializeServiceResponse(ok, *res);
    return ok;
  }